

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hpp
# Opt level: O2

Op * __thiscall
xercesc_4_0::RegularExpression::compileClosure
          (RegularExpression *this,Token *token,Op *next,bool reverse,tokType tkType)

{
  int iVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  ChildOp *this_01;
  ChildOp *pCVar4;
  Op *pOVar5;
  XMLSize_t XVar6;
  uint id;
  int iVar7;
  bool bVar8;
  Token *this_00;
  
  iVar1 = (*token->_vptr_Token[2])(token,0);
  this_00 = (Token *)CONCAT44(extraout_var,iVar1);
  iVar1 = (*token->_vptr_Token[4])(token);
  iVar2 = (*token->_vptr_Token[5])(token);
  this_01 = (ChildOp *)next;
  if (iVar1 == iVar2 && -1 < iVar1) {
    while (bVar8 = iVar1 != 0, iVar1 = iVar1 + -1, bVar8) {
      this_01 = (ChildOp *)compile(this,this_00,&this_01->super_Op,reverse);
    }
  }
  else {
    iVar3 = 0;
    if (0 < iVar1) {
      iVar3 = iVar1;
    }
    if (iVar2 < 1) {
      iVar3 = 0;
    }
    iVar7 = iVar2 - iVar3;
    if (iVar7 == 0 || iVar2 < iVar3) {
      if (tkType == T_NONGREEDYCLOSURE) {
        this_01 = OpFactory::createNonGreedyClosureOp(&this->fOpFactory);
      }
      else {
        XVar6 = Token::getMinLength(this_00);
        if (XVar6 == 0) {
          id = this->fNoClosures;
          this->fNoClosures = id + 1;
        }
        else {
          id = 0xffffffff;
        }
        this_01 = OpFactory::createClosureOp(&this->fOpFactory,id);
      }
      (this_01->super_Op).fNextOp = next;
      if ((next == (Op *)0x0) ||
         (bVar8 = doTokenOverlap(this,next,this_00), pCVar4 = this_01, !bVar8)) {
        (this_01->super_Op).fOpType = (tkType == T_NONGREEDYCLOSURE) + O_FINITE_CLOSURE;
        pCVar4 = (ChildOp *)0x0;
      }
      pOVar5 = compile(this,this_00,&pCVar4->super_Op,reverse);
      ChildOp::setChild(this_01,pOVar5);
    }
    else {
      while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
        pCVar4 = OpFactory::createQuestionOp(&this->fOpFactory,tkType == T_NONGREEDYCLOSURE);
        (pCVar4->super_Op).fNextOp = next;
        pOVar5 = compile(this,this_00,&this_01->super_Op,reverse);
        ChildOp::setChild(pCVar4,pOVar5);
        this_01 = pCVar4;
      }
    }
    if (0 < iVar1) {
      while (bVar8 = iVar1 != 0, iVar1 = iVar1 + -1, bVar8) {
        this_01 = (ChildOp *)compile(this,this_00,&this_01->super_Op,reverse);
      }
    }
  }
  return &this_01->super_Op;
}

Assistant:

inline Op* RegularExpression::compileClosure(const Token* const token,
                                               Op* const next,
                                               const bool reverse,
                                               const Token::tokType tkType) {

      Op*    ret      = 0;
      Token* childTok = token->getChild(0);
      int    min      = token->getMin();
      int    max      = token->getMax();

      if (min >= 0 && min == max) {

          ret = next;
          for (int i=0; i< min; i++) {
              ret = compile(childTok, ret, reverse);
          }

          return ret;
      }

      if (min > 0 && max > 0)
          max -= min;

      if (max > 0) {

          ret = next;
          for (int i=0; i<max; i++) {

              ChildOp* childOp = fOpFactory.createQuestionOp(
                  tkType == Token::T_NONGREEDYCLOSURE);

              childOp->setNextOp(next);
              childOp->setChild(compile(childTok, ret, reverse));
              ret = childOp;
          }
      }
      else {

          ChildOp* childOp = 0;

          if (tkType == Token::T_NONGREEDYCLOSURE) {
              childOp = fOpFactory.createNonGreedyClosureOp();
          }
          else {

              if (childTok->getMinLength() == 0)
                  childOp = fOpFactory.createClosureOp(fNoClosures++);
              else
                  childOp = fOpFactory.createClosureOp(-1);
          }

          childOp->setNextOp(next);
          if(next==NULL || !doTokenOverlap(next, childTok))
          {
              childOp->setOpType(tkType == Token::T_NONGREEDYCLOSURE?Op::O_FINITE_NONGREEDYCLOSURE:Op::O_FINITE_CLOSURE);
              childOp->setChild(compile(childTok, NULL, reverse));
          }
          else
          {
              childOp->setChild(compile(childTok, childOp, reverse));
          }
          ret = childOp;
      }

      if (min > 0) {

          for (int i=0; i< min; i++) {
              ret = compile(childTok, ret, reverse);
          }
      }

      return ret;
  }